

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O2

bool __thiscall mkvmuxer::Frame::IsValid(Frame *this)

{
  bool bVar1;
  
  bVar1 = false;
  if ((this->length_ != 0) && (bVar1 = false, this->frame_ != (uint8_t *)0x0)) {
    if (((this->additional_length_ == 0 || this->additional_ != (uint8_t *)0x0) &&
        ((this->additional_length_ != 0 || this->additional_ == (uint8_t *)0x0 &&
         (0xffffffffffffff81 < this->track_number_ - 0x7f)))) &&
       ((bVar1 = CanBeSimpleBlock(this), bVar1 ||
        ((this->is_key_ != false || (this->reference_block_timestamp_set_ == true)))))) {
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool Frame::IsValid() const {
  if (length_ == 0 || !frame_) {
    return false;
  }
  if ((additional_length_ != 0 && !additional_) ||
      (additional_ != NULL && additional_length_ == 0)) {
    return false;
  }
  if (track_number_ == 0 || track_number_ > kMaxTrackNumber) {
    return false;
  }
  if (!CanBeSimpleBlock() && !is_key_ && !reference_block_timestamp_set_) {
    return false;
  }
  return true;
}